

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::BriefUnitTestResultPrinter::OnTestIterationEnd
          (BriefUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppTVar2;
  UnitTestImpl *this_00;
  _Alloc_hider _Var3;
  bool bVar4;
  uint uVar5;
  pointer ppTVar6;
  char *pcVar7;
  undefined4 in_register_00000014;
  uint uVar8;
  char *in_R8;
  string local_60;
  string local_40;
  
  uVar8 = 0;
  ColoredPrintf(kGreen,"[==========] ",CONCAT44(in_register_00000014,param_2));
  uVar5 = UnitTestImpl::test_to_run_count(unit_test->impl_);
  FormatCountableNoun_abi_cxx11_(&local_60,(testing *)(ulong)uVar5,0x17bfea,"tests",in_R8);
  _Var3._M_p = local_60._M_dataplus._M_p;
  ppTVar6 = (unit_test->impl_->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar2 = (unit_test->impl_->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar6 != ppTVar2) {
    uVar8 = 0;
    do {
      uVar8 = uVar8 + (*ppTVar6)->should_run_;
      ppTVar6 = ppTVar6 + 1;
    } while (ppTVar6 != ppTVar2);
  }
  FormatCountableNoun_abi_cxx11_(&local_40,(testing *)(ulong)uVar8,0x17dfa9,"test suites",in_R8);
  printf("%s from %s ran.",_Var3._M_p,local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  paVar1 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (FLAGS_gtest_print_time == '\x01') {
    local_40._M_dataplus._M_p = (pointer)unit_test->impl_->elapsed_time_;
    StreamableToString<long>(&local_60,(long *)&local_40);
    printf(" (%s ms total)",local_60._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  putchar(10);
  ColoredPrintf(kGreen,"[  PASSED  ] ");
  uVar5 = UnitTestImpl::successful_test_count(unit_test->impl_);
  FormatCountableNoun_abi_cxx11_(&local_60,(testing *)(ulong)uVar5,0x17bfea,"tests",in_R8);
  printf("%s.\n",local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  uVar5 = UnitTestImpl::skipped_test_count(unit_test->impl_);
  if (0 < (int)uVar5) {
    ColoredPrintf(kGreen,"[  SKIPPED ] ");
    FormatCountableNoun_abi_cxx11_(&local_60,(testing *)(ulong)uVar5,0x17bfea,"tests",in_R8);
    printf("%s.\n",local_60._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  this_00 = unit_test->impl_;
  uVar5 = UnitTestImpl::reportable_disabled_test_count(this_00);
  if ((uVar5 != 0) && (FLAGS_gtest_also_run_disabled_tests == '\0')) {
    bVar4 = UnitTestImpl::Passed(this_00);
    if (bVar4) {
      putchar(10);
    }
    pcVar7 = "TESTS";
    if (uVar5 == 1) {
      pcVar7 = "TEST";
    }
    ColoredPrintf(kYellow,"  YOU HAVE %d DISABLED %s\n\n",(ulong)uVar5,pcVar7);
  }
  fflush(_stdout);
  return;
}

Assistant:

void BriefUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                    int /*iteration*/) {
  ColoredPrintf(GTestColor::kGreen, "[==========] ");
  printf("%s from %s ran.",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestSuiteCount(unit_test.test_suite_to_run_count()).c_str());
  if (GTEST_FLAG_GET(print_time)) {
    printf(" (%s ms total)",
           internal::StreamableToString(unit_test.elapsed_time()).c_str());
  }
  printf("\n");
  ColoredPrintf(GTestColor::kGreen, "[  PASSED  ] ");
  printf("%s.\n", FormatTestCount(unit_test.successful_test_count()).c_str());

  const int skipped_test_count = unit_test.skipped_test_count();
  if (skipped_test_count > 0) {
    ColoredPrintf(GTestColor::kGreen, "[  SKIPPED ] ");
    printf("%s.\n", FormatTestCount(skipped_test_count).c_str());
  }

  int num_disabled = unit_test.reportable_disabled_test_count();
  if (num_disabled && !GTEST_FLAG_GET(also_run_disabled_tests)) {
    if (unit_test.Passed()) {
      printf("\n");  // Add a spacer if no FAILURE banner is displayed.
    }
    ColoredPrintf(GTestColor::kYellow, "  YOU HAVE %d DISABLED %s\n\n",
                  num_disabled, num_disabled == 1 ? "TEST" : "TESTS");
  }
  // Ensure that Google Test output is printed before, e.g., heapchecker output.
  fflush(stdout);
}